

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

float loss_cs(warm_cb *data,v_array<COST_SENSITIVE::wclass> *costs,uint32_t final_prediction)

{
  wclass *pwVar1;
  wclass *pwVar2;
  v_array<COST_SENSITIVE::wclass> *__range1;
  float fVar3;
  
  if (costs->_begin == costs->_end) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = 0.0;
    pwVar1 = costs->_begin;
    do {
      pwVar2 = pwVar1 + 1;
      if (pwVar1->class_index == final_prediction) {
        fVar3 = pwVar1->x;
        break;
      }
      pwVar1 = pwVar2;
    } while (pwVar2 != costs->_end);
  }
  return (data->loss1 - data->loss0) * fVar3 + data->loss0;
}

Assistant:

float loss_cs(warm_cb& data, v_array<COST_SENSITIVE::wclass>& costs, uint32_t final_prediction)
{
  float cost = 0.;
  for (auto wc : costs)
  { if (wc.class_index == final_prediction)
    { cost = wc.x;
      break;
    }
  }
  return data.loss0 + (data.loss1 - data.loss0) * cost;
}